

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdesolver_smooth.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint local_c4;
  uint local_c0;
  uint space_iter;
  uint time_iter;
  uint global_iter;
  double *results [8];
  Gas_parameters gas_parameters;
  Iterative_Method_parameters method_parameters;
  char **argv_local;
  int argc_local;
  
  space_iter = 0;
  initialize_iterative_algorithm_parameters
            ((Iterative_Method_parameters *)&gas_parameters.artificial_viscosity,argc,argv);
  print_iterative_algorithm_info
            ((Iterative_Method_parameters *)&gas_parameters.artificial_viscosity);
  gas_parameters_Initialize((Gas_parameters *)(results + 7));
  results_Construct((double **)&time_iter,0x10);
  for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < 4; local_c4 = local_c4 + 1) {
      process_iteration((Iterative_Method_parameters *)&gas_parameters.artificial_viscosity,
                        (Gas_parameters *)(results + 7),local_c0,local_c4,space_iter,
                        (double **)&time_iter);
      space_iter = space_iter + 1;
    }
  }
  export_results((double **)&time_iter,0x10);
  results_Destruct((double **)&time_iter);
  return 0;
}

Assistant:

int main (int argc, char * argv[])
{
  Iterative_Method_parameters method_parameters;
  Gas_parameters gas_parameters;

  double * results[RESULTS_SIZE];
  unsigned global_iter = 0,
           time_iter   = 0,
           space_iter  = 0;

  /* Initialize global structures */
  initialize_iterative_algorithm_parameters (&method_parameters, argc, argv);
  print_iterative_algorithm_info (&method_parameters);
  gas_parameters_Initialize (&gas_parameters);
  results_Construct (results, time_maxiter * space_maxiter);

  /* The main loop */
  for (time_iter = 0; time_iter < time_maxiter; time_iter++) {
    for (space_iter = 0; space_iter < space_maxiter; space_iter++) {
      process_iteration(&method_parameters, &gas_parameters,
                        time_iter, space_iter, global_iter, results);
      global_iter++;
    }
  }

  /* Export results and cleanup */
  export_results (results, time_maxiter * space_maxiter);
  results_Destruct (results);

  return 0;
}